

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompressLegacy.c
# Opt level: O0

UINTN TianoCompressLegacy(void *SrcBuffer,UINT32 SrcSize,void *DstBuffer,UINT32 *DstSize)

{
  INT32 IVar1;
  INT32 Status;
  UINT32 *DstSize_local;
  void *DstBuffer_local;
  UINT32 SrcSize_local;
  void *SrcBuffer_local;
  
  mPbit = '\x05';
  mBufSiz = 0;
  mBuf = (UINT8 *)0x0;
  mText = (UINT8 *)0x0;
  mLevel = (UINT8 *)0x0;
  mChildCount = (UINT8 *)0x0;
  mPosition = (NODE_conflict *)0x0;
  mParent = (NODE_conflict *)0x0;
  mPrev = (NODE_conflict *)0x0;
  mNext = (NODE_conflict *)0x0;
  mSrcUpperLimit = (UINT8 *)((long)SrcBuffer + (ulong)SrcSize);
  mDstUpperLimit = (UINT8 *)((long)DstBuffer + (ulong)*DstSize);
  mSrc = (UINT8 *)SrcBuffer;
  mDst = (UINT8 *)DstBuffer;
  PutDword(0);
  PutDword(0);
  MakeCrcTable();
  mCompSize = 0;
  mOrigSize = 0;
  mCrc = 0;
  IVar1 = Encode();
  if (IVar1 == 0) {
    if (mDst < mDstUpperLimit) {
      *mDst = '\0';
    }
    mDst = (UINT8 *)DstBuffer;
    PutDword(mCompSize + 1);
    PutDword(mOrigSize);
    if (*DstSize < mCompSize + 9) {
      *DstSize = mCompSize + 9;
      SrcBuffer_local = (void *)0x2;
    }
    else {
      *DstSize = mCompSize + 9;
      SrcBuffer_local = (void *)0x0;
    }
  }
  else {
    SrcBuffer_local = (void *)0x3;
  }
  return (UINTN)SrcBuffer_local;
}

Assistant:

EFI_STATUS
TianoCompressLegacy (
CONST VOID   *SrcBuffer,
UINT32  SrcSize,
VOID   *DstBuffer,
UINT32  *DstSize
)
  /*++

  Routine Description:

  The internal implementation of [Efi/Tiano]Compress().

  Arguments:

  SrcBuffer   - The buffer storing the source data
  SrcSize     - The size of source data
  DstBuffer   - The buffer to store the compressed data
  DstSize     - On input, the size of DstBuffer; On output,
  the size of the actual compressed data.
  Version     - The version of de/compression algorithm.
  Version 1 for UEFI 2.0 de/compression algorithm.
  Version 2 for Tiano de/compression algorithm.

  Returns:

  EFI_BUFFER_TOO_SMALL  - The DstBuffer is too small. this case,
  DstSize contains the size needed.
  EFI_SUCCESS           - Compression is successful.
  EFI_OUT_OF_RESOURCES  - No resource to complete function.
  EFI_INVALID_PARAMETER - Parameter supplied is wrong.

  --*/
{
  INT32 Status;

  //
  // Initializations
  //
  mPbit = 5;

  mBufSiz         = 0;
  mBuf            = NULL;
  mText           = NULL;
  mLevel          = NULL;
  mChildCount     = NULL;
  mPosition       = NULL;
  mParent         = NULL;
  mPrev           = NULL;
  mNext           = NULL;

  mSrc            = (UINT8*) SrcBuffer;
  mSrcUpperLimit  = mSrc + SrcSize;
  mDst            = DstBuffer;
  mDstUpperLimit  = mDst +*DstSize;

  PutDword (0L);
  PutDword (0L);

  MakeCrcTable ();

  mOrigSize             = mCompSize = 0;
  mCrc                  = INIT_CRC;

  //
  // Compress it
  //
  Status = Encode ();
  if (Status) {
    return EFI_OUT_OF_RESOURCES;
  }
  //
  // Null terminate the compressed data
  //
  if (mDst < mDstUpperLimit) {
    *mDst++ = 0;
  }
  //
  // Fill compressed size and original size
  //
  mDst = DstBuffer;
  PutDword (mCompSize + 1);
  PutDword (mOrigSize);

  //
  // Return
  //
  if (mCompSize + 1 + 8 > *DstSize) {
    *DstSize = mCompSize + 1 + 8;
    return EFI_BUFFER_TOO_SMALL;
  } else {
    *DstSize = mCompSize + 1 + 8;
    return EFI_SUCCESS;
  }

}